

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_build(nk_context *ctx)

{
  nk_cursor *img;
  void *pvVar1;
  nk_window *pnVar2;
  nk_rect r;
  bool bVar3;
  nk_popup_buffer *buf;
  nk_window *next_1;
  nk_window *next;
  nk_cursor *cursor;
  nk_rect mouse_bounds;
  nk_byte *buffer;
  nk_command *cmd;
  nk_window *it;
  nk_context *ctx_local;
  
  buffer = (nk_byte *)0x0;
  if ((ctx->style).cursor_active == (nk_cursor *)0x0) {
    (ctx->style).cursor_active = (ctx->style).cursors[0];
  }
  if ((((ctx->style).cursor_active != (nk_cursor *)0x0) && ((ctx->input).mouse.grabbed == '\0')) &&
     ((ctx->style).cursor_visible != 0)) {
    img = (ctx->style).cursor_active;
    nk_command_buffer_init(&ctx->overlay,&ctx->memory,NK_CLIPPING_OFF);
    nk_start_buffer(ctx,&ctx->overlay);
    r.y = (ctx->input).mouse.pos.y - (img->offset).y;
    r.x = (ctx->input).mouse.pos.x - (img->offset).x;
    r.w = (img->size).x;
    r.h = (img->size).y;
    nk_draw_image(&ctx->overlay,r,&img->img,(nk_color)0xffffffff);
    nk_finish_buffer(ctx,&ctx->overlay);
  }
  pvVar1 = (ctx->memory).memory.ptr;
  cmd = (nk_command *)ctx->begin;
  while (cmd != (nk_command *)0x0) {
    next_1 = *(nk_window **)(cmd + 0x1c);
    if (((*(long *)(cmd + 10) != *(long *)(cmd + 9)) && ((cmd[4].next & 0x2000) == 0)) &&
       (cmd->type == ctx->seq)) {
      buffer = (nk_byte *)((long)pvVar1 + *(long *)(cmd + 10));
      while( true ) {
        bVar3 = false;
        if (((next_1 != (nk_window *)0x0) &&
            (bVar3 = true, (next_1->buffer).last != (next_1->buffer).begin)) &&
           (bVar3 = true, (next_1->flags & 0x2000) == 0)) {
          bVar3 = next_1->seq != ctx->seq;
        }
        if (!bVar3) break;
        next_1 = next_1->next;
      }
      if (next_1 != (nk_window *)0x0) {
        *(nk_size *)(buffer + 8) = (next_1->buffer).begin;
      }
    }
    cmd = (nk_command *)next_1;
  }
  pnVar2 = ctx->begin;
  while (cmd = (nk_command *)pnVar2, cmd != (nk_command *)0x0) {
    pnVar2 = *(nk_window **)(cmd + 0x1c);
    if (cmd[0x15].type != NK_COMMAND_NOP) {
      *(undefined8 *)(buffer + 8) = *(undefined8 *)(cmd + 0x13);
      buffer = (nk_byte *)((long)pvVar1 + *(long *)(cmd + 0x14));
      cmd[0x15].type = NK_COMMAND_NOP;
    }
  }
  if (buffer != (nk_byte *)0x0) {
    if ((ctx->overlay).end == (ctx->overlay).begin) {
      *(nk_size *)(buffer + 8) = (ctx->memory).allocated;
    }
    else {
      *(nk_size *)(buffer + 8) = (ctx->overlay).begin;
    }
  }
  return;
}

Assistant:

NK_LIB void
nk_build(struct nk_context *ctx)
{
    struct nk_window *it = 0;
    struct nk_command *cmd = 0;
    nk_byte *buffer = 0;

    /* draw cursor overlay */
    if (!ctx->style.cursor_active)
        ctx->style.cursor_active = ctx->style.cursors[NK_CURSOR_ARROW];
    if (ctx->style.cursor_active && !ctx->input.mouse.grabbed && ctx->style.cursor_visible) {
        struct nk_rect mouse_bounds;
        const struct nk_cursor *cursor = ctx->style.cursor_active;
        nk_command_buffer_init(&ctx->overlay, &ctx->memory, NK_CLIPPING_OFF);
        nk_start_buffer(ctx, &ctx->overlay);

        mouse_bounds.x = ctx->input.mouse.pos.x - cursor->offset.x;
        mouse_bounds.y = ctx->input.mouse.pos.y - cursor->offset.y;
        mouse_bounds.w = cursor->size.x;
        mouse_bounds.h = cursor->size.y;

        nk_draw_image(&ctx->overlay, mouse_bounds, &cursor->img, nk_white);
        nk_finish_buffer(ctx, &ctx->overlay);
    }
    /* build one big draw command list out of all window buffers */
    it = ctx->begin;
    buffer = (nk_byte*)ctx->memory.memory.ptr;
    while (it != 0) {
        struct nk_window *next = it->next;
        if (it->buffer.last == it->buffer.begin || (it->flags & NK_WINDOW_HIDDEN)||
            it->seq != ctx->seq)
            goto cont;

        cmd = nk_ptr_add(struct nk_command, buffer, it->buffer.last);
        while (next && ((next->buffer.last == next->buffer.begin) ||
            (next->flags & NK_WINDOW_HIDDEN) || next->seq != ctx->seq))
            next = next->next; /* skip empty command buffers */

        if (next) cmd->next = next->buffer.begin;
        cont: it = next;
    }
    /* append all popup draw commands into lists */
    it = ctx->begin;
    while (it != 0) {
        struct nk_window *next = it->next;
        struct nk_popup_buffer *buf;
        if (!it->popup.buf.active)
            goto skip;

        buf = &it->popup.buf;
        cmd->next = buf->begin;
        cmd = nk_ptr_add(struct nk_command, buffer, buf->last);
        buf->active = nk_false;
        skip: it = next;
    }
    if (cmd) {
        /* append overlay commands */
        if (ctx->overlay.end != ctx->overlay.begin)
            cmd->next = ctx->overlay.begin;
        else cmd->next = ctx->memory.allocated;
    }
}